

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,int32_t inByte)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  UStringTrieResult UVar4;
  UStringTrieResult UVar5;
  uint inByte_00;
  byte *pos;
  
  pbVar3 = this->pos_;
  UVar4 = USTRINGTRIE_NO_MATCH;
  if (pbVar3 != (byte *)0x0) {
    inByte_00 = ((uint)inByte >> 0x17 & 0x100) + inByte;
    iVar2 = this->remainingMatchLength_;
    if (iVar2 < 0) {
      bVar1 = *pbVar3;
      while( true ) {
        pos = pbVar3 + 1;
        if (bVar1 < 0x10) {
          UVar4 = branchNext(this,pos,(uint)bVar1,inByte_00);
          return UVar4;
        }
        if (bVar1 < 0x20) break;
        if ((bVar1 & 1) != 0) goto LAB_00301075;
        if (0xa1 < bVar1) {
          if (bVar1 < 0xd8) {
            pos = pbVar3 + 2;
          }
          else if (bVar1 < 0xfc) {
            pos = pbVar3 + 3;
          }
          else {
            pos = pos + (ulong)((bVar1 >> 1 & 1) != 0) + 3;
          }
        }
        bVar1 = *pos;
        pbVar3 = pos;
      }
      if (*pos == inByte_00) {
        this->remainingMatchLength_ = bVar1 - 0x11;
        this->pos_ = pbVar3 + 2;
        if (bVar1 != 0x10) {
          return USTRINGTRIE_NO_VALUE;
        }
        UVar4 = (UStringTrieResult)pbVar3[2];
        if (UVar4 < 0x20) {
          return USTRINGTRIE_NO_VALUE;
        }
        return UVar4 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
LAB_00301075:
      this->pos_ = (uint8_t *)0x0;
      return USTRINGTRIE_NO_MATCH;
    }
    if (inByte_00 == *pbVar3) {
      UVar4 = USTRINGTRIE_NO_VALUE;
      this->remainingMatchLength_ = iVar2 + -1;
      this->pos_ = pbVar3 + 1;
      if ((iVar2 == 0) && (UVar5 = (UStringTrieResult)pbVar3[1], 0x1f < UVar5)) {
        return UVar5 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
    }
    else {
      this->pos_ = (uint8_t *)0x0;
    }
  }
  return UVar4;
}

Assistant:

UStringTrieResult
BytesTrie::next(int32_t inByte) {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    if(inByte<0) {
        inByte+=0x100;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(inByte==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, inByte);
}